

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandListVkImpl.hpp
# Opt level: O2

void __thiscall Diligent::CommandListVkImpl::~CommandListVkImpl(CommandListVkImpl *this)

{
  ~CommandListVkImpl(this);
  free(this);
  return;
}

Assistant:

~CommandListVkImpl()
    {
        VERIFY(m_vkCmdBuff == VK_NULL_HANDLE && !m_pDeferredCtx, "Destroying command list that was never executed");
    }